

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O0

xmlSchemaWhitespaceValueType xmlSchemaGetWhiteSpaceFacetValue(xmlSchemaTypePtr type)

{
  xmlSchemaTypePtr type_local;
  
  if (type->type == XML_SCHEMA_TYPE_BASIC) {
    if ((type->builtInType == 1) || (type->builtInType == 0x2e)) {
      type_local._4_4_ = XML_SCHEMA_WHITESPACE_PRESERVE;
    }
    else if (type->builtInType == 2) {
      type_local._4_4_ = XML_SCHEMA_WHITESPACE_REPLACE;
    }
    else {
      type_local._4_4_ = XML_SCHEMA_WHITESPACE_COLLAPSE;
    }
  }
  else if ((type->flags & 0x40U) == 0) {
    if ((type->flags & 0x80U) == 0) {
      if ((type->flags & 0x100U) == 0) {
        type_local._4_4_ = ~XML_SCHEMA_WHITESPACE_UNKNOWN;
      }
      else if ((type->flags & 0x1000000U) == 0) {
        if ((type->flags & 0x2000000U) == 0) {
          type_local._4_4_ = XML_SCHEMA_WHITESPACE_COLLAPSE;
        }
        else {
          type_local._4_4_ = XML_SCHEMA_WHITESPACE_REPLACE;
        }
      }
      else {
        type_local._4_4_ = XML_SCHEMA_WHITESPACE_PRESERVE;
      }
    }
    else {
      type_local._4_4_ = XML_SCHEMA_WHITESPACE_UNKNOWN;
    }
  }
  else {
    type_local._4_4_ = XML_SCHEMA_WHITESPACE_COLLAPSE;
  }
  return type_local._4_4_;
}

Assistant:

static xmlSchemaWhitespaceValueType
xmlSchemaGetWhiteSpaceFacetValue(xmlSchemaTypePtr type)
{
    /*
    * The normalization type can be changed only for types which are derived
    * from xsd:string.
    */
    if (type->type == XML_SCHEMA_TYPE_BASIC) {
	/*
	* Note that we assume a whitespace of preserve for anySimpleType.
	*/
	if ((type->builtInType == XML_SCHEMAS_STRING) ||
	    (type->builtInType == XML_SCHEMAS_ANYSIMPLETYPE))
	    return(XML_SCHEMA_WHITESPACE_PRESERVE);
	else if (type->builtInType == XML_SCHEMAS_NORMSTRING)
	    return(XML_SCHEMA_WHITESPACE_REPLACE);
	else {
	    /*
	    * For all `atomic` datatypes other than string (and types `derived`
	    * by `restriction` from it) the value of whiteSpace is fixed to
	    * collapse
	    * Note that this includes built-in list datatypes.
	    */
	    return(XML_SCHEMA_WHITESPACE_COLLAPSE);
	}
    } else if (WXS_IS_LIST(type)) {
	/*
	* For list types the facet "whiteSpace" is fixed to "collapse".
	*/
	return (XML_SCHEMA_WHITESPACE_COLLAPSE);
    } else if (WXS_IS_UNION(type)) {
	return (XML_SCHEMA_WHITESPACE_UNKNOWN);
    } else if (WXS_IS_ATOMIC(type)) {
	if (type->flags & XML_SCHEMAS_TYPE_WHITESPACE_PRESERVE)
	    return (XML_SCHEMA_WHITESPACE_PRESERVE);
	else if (type->flags & XML_SCHEMAS_TYPE_WHITESPACE_REPLACE)
	    return (XML_SCHEMA_WHITESPACE_REPLACE);
	else
	    return (XML_SCHEMA_WHITESPACE_COLLAPSE);
    }
    return (-1);
}